

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindFileCommand.cxx
# Opt level: O2

void __thiscall
cmFindFileCommand::cmFindFileCommand(cmFindFileCommand *this,cmExecutionStatus *status)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"find_file",&local_39);
  cmFindPathCommand::cmFindPathCommand(&this->super_cmFindPathCommand,&local_38,status);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_cmFindPathCommand).super_cmFindBase._vptr_cmFindBase =
       (_func_int **)&PTR__cmFindBase_00854100;
  (this->super_cmFindPathCommand).IncludeFileInPath = true;
  (this->super_cmFindPathCommand).super_cmFindBase.VariableType = FILEPATH;
  return;
}

Assistant:

cmFindFileCommand::cmFindFileCommand(cmExecutionStatus& status)
  : cmFindPathCommand("find_file", status)
{
  this->IncludeFileInPath = true;
  this->VariableType = cmStateEnums::FILEPATH;
}